

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void P_MarkGlobalVarStrings(void)

{
  ulong local_10;
  size_t i;
  
  ACSStringPool::MarkStringArray(&GlobalACSStrings,ACS_GlobalVars,0x40);
  for (local_10 = 0; local_10 < 0x40; local_10 = local_10 + 1) {
    ACSStringPool::MarkStringMap(&GlobalACSStrings,ACS_GlobalArrays + local_10);
  }
  return;
}

Assistant:

void P_MarkGlobalVarStrings()
{
	GlobalACSStrings.MarkStringArray(ACS_GlobalVars, countof(ACS_GlobalVars));
	for (size_t i = 0; i < countof(ACS_GlobalArrays); ++i)
	{
		GlobalACSStrings.MarkStringMap(ACS_GlobalArrays[i]);
	}
}